

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool P_CheckMissileSpawn(AActor *th,double maxdist)

{
  byte bVar1;
  line_t *plVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FCheckPosition tm;
  DVector2 local_c8;
  FCheckPosition local_b8;
  
  if ((((th->flags4).Value & 0x10) != 0) && (0 < th->tics)) {
    uVar4 = FRandom::GenRand32(&pr_checkmissilespawn);
    iVar6 = th->tics - (uVar4 & 3);
    iVar5 = 1;
    if (1 < iVar6) {
      iVar5 = iVar6;
    }
    th->tics = iVar5;
  }
  if (0.0 < maxdist) {
    dVar10 = (th->Vel).X;
    dVar8 = (th->Vel).Y;
    dVar9 = (th->Vel).Z;
    do {
      dVar10 = dVar10 * 0.5;
      dVar8 = dVar8 * 0.5;
      dVar9 = dVar9 * 0.5;
    } while (maxdist * maxdist <= dVar8 * dVar8 + dVar10 * dVar10);
    (th->__Pos).Z = dVar9 + (th->__Pos).Z;
    (th->__Pos).Y = dVar8 + (th->__Pos).Y;
    (th->__Pos).X = dVar10 + (th->__Pos).X;
  }
  bVar1 = *(byte *)((long)&(th->flags2).Value + 1);
  bVar7 = false;
  local_b8.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_b8.LastRipped,1);
  local_b8.PushTime = 0;
  local_b8.FromPMove = false;
  if (((th->flags).Value & 0x10000) != 0) {
    bVar7 = ((th->BounceFlags).Value & 0x1000) == 0;
  }
  local_c8.X = (th->__Pos).X;
  local_c8.Y = (th->__Pos).Y;
  local_b8.DoRipping = (bool)(bVar1 & 1);
  bVar3 = P_TryMove(th,&local_c8,0,(secplane_t *)0x0,&local_b8,true);
  if ((bVar3) ||
     (((th->BlockingMobj != (AActor *)0x0 && (((th->flags2).Value & 0x100) != 0)) &&
      (((th->BlockingMobj->flags5).Value & 0x80000) == 0)))) {
    dVar10 = (th->__Pos).X;
    dVar8 = (th->__Pos).Y;
    (th->Prev).Z = (th->__Pos).Z;
    (th->Prev).X = dVar10;
    (th->Prev).Y = dVar8;
    (th->PrevAngles).Roll.Degrees = (th->Angles).Roll.Degrees;
    dVar10 = (th->Angles).Yaw.Degrees;
    (th->PrevAngles).Pitch.Degrees = (th->Angles).Pitch.Degrees;
    (th->PrevAngles).Yaw.Degrees = dVar10;
    if (th->Sector == (sector_t *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = th->Sector->PortalGroup;
    }
    th->PrevPortalGroup = iVar5;
    bVar7 = true;
  }
  else {
    AActor::ClearCounters(th);
    plVar2 = th->BlockingLine;
    if ((plVar2 == (line_t *)0x0) || (plVar2->special != 9)) {
      if (bVar7 || plVar2 == (line_t *)0x0) {
        bVar7 = false;
        P_ExplodeMissile(th,(line_t *)0x0,th->BlockingMobj);
        goto LAB_00528d79;
      }
      P_BounceWall(th);
    }
    else {
      (*(th->super_DThinker).super_DObject._vptr_DObject[4])(th);
    }
    bVar7 = false;
  }
LAB_00528d79:
  M_Free(local_b8.LastRipped.Nodes);
  return bVar7;
}

Assistant:

bool P_CheckMissileSpawn (AActor* th, double maxdist)
{
	// [RH] Don't decrement tics if they are already less than 1
	if ((th->flags4 & MF4_RANDOMIZE) && th->tics > 0)
	{
		th->tics -= pr_checkmissilespawn() & 3;
		if (th->tics < 1)
			th->tics = 1;
	}

	if (maxdist > 0)
	{
		// move a little forward so an angle can be computed if it immediately explodes
		DVector3 advance = th->Vel;
		double maxsquared = maxdist*maxdist;

		// Keep halving the advance vector until we get something less than maxdist
		// units away, since we still want to spawn the missile inside the shooter.
		do
		{
			advance *= 0.5f;
		}
		while (advance.XY().LengthSquared() >= maxsquared);
		th->SetXYZ(th->Pos() + advance);
	}

	FCheckPosition tm(!!(th->flags2 & MF2_RIP));

	// killough 8/12/98: for non-missile objects (e.g. grenades)
	// 
	// [GZ] MBF excludes non-missile objects from the P_TryMove test
	// and subsequent potential P_ExplodeMissile call. That is because
	// in MBF, a projectile is not an actor with the MF_MISSILE flag
	// but an actor with either or both the MF_MISSILE and MF_BOUNCES
	// flags, and a grenade is identified by not having MF_MISSILE.
	// Killough wanted grenades not to explode directly when spawned,
	// therefore they can be fired safely even when humping a wall as
	// they will then just drop on the floor at their shooter's feet.
	//
	// However, ZDoom does allow non-missiles to be shot as well, so
	// Killough's check for non-missiles is inadequate here. So let's
	// replace it by a check for non-missile and MBF bounce type.
	// This should allow MBF behavior where relevant without altering
	// established ZDoom behavior for crazy stuff like a cacodemon cannon.
	bool MBFGrenade = (!(th->flags & MF_MISSILE) || (th->BounceFlags & BOUNCE_MBF));

	// killough 3/15/98: no dropoff (really = don't care for missiles)
	if (!(P_TryMove (th, th->Pos(), false, NULL, tm, true)))
	{
		// [RH] Don't explode ripping missiles that spawn inside something
		if (th->BlockingMobj == NULL || !(th->flags2 & MF2_RIP) || (th->BlockingMobj->flags5 & MF5_DONTRIP))
		{
			// If this is a monster spawned by A_CustomMissile subtract it from the counter.
			th->ClearCounters();
			// [RH] Don't explode missiles that spawn on top of horizon lines
			if (th->BlockingLine != NULL && th->BlockingLine->special == Line_Horizon)
			{
				th->Destroy ();
			}
			else if (MBFGrenade && th->BlockingLine != NULL)
			{
				P_BounceWall(th);
			}
			else
			{
				P_ExplodeMissile (th, NULL, th->BlockingMobj);
			}
			return false;
		}
	}
	th->ClearInterpolation();
	return true;
}